

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ostream *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  mapped_type *this;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  const_iterator __begin0;
  long *plVar7;
  pointer __x;
  pointer pEVar8;
  uint uVar9;
  size_t *psVar10;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  const_iterator __end0;
  initializer_list<Employee> __l;
  initializer_list<float> __l_00;
  int age_thresh;
  vector<Employee,_std::allocator<Employee>_> employees;
  string __str;
  string __str_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  grouped;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  grouped_transformed;
  vector<Employee,_std::allocator<Employee>_> age_gt_40;
  undefined1 local_220 [8];
  pointer pfStack_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [2];
  vector<Employee,_std::allocator<Employee>_> local_1f0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  key_type local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  local_178;
  value_type *local_140;
  undefined1 local_138 [32];
  _Base_ptr local_118;
  size_t local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined4 local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined4 local_80;
  long *local_78 [2];
  long local_68 [2];
  undefined8 local_58;
  undefined4 local_50;
  vector<Employee,_std::allocator<Employee>_> local_48;
  
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Fatih","");
  local_118 = (_Base_ptr)0x2300000001;
  local_110 = CONCAT44(local_110._4_4_,8500.0);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Elif","");
  local_e8 = 0x1c00000000;
  local_e0 = 0x45c67000;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Erkin","");
  local_b8 = 0x2b00000001;
  local_b0 = 0x46147000;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Mehmet","");
  local_88 = 0x2e00000001;
  local_80 = 0x46241000;
  plVar7 = local_68;
  local_78[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Melis","");
  local_58 = 0x3000000000;
  local_50 = 0x46435000;
  __l._M_len = 5;
  __l._M_array = (iterator)local_138;
  std::vector<Employee,_std::allocator<Employee>_>::vector
            (&local_1f0,__l,(allocator_type *)&local_178);
  lVar13 = -0xf0;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -6;
    lVar13 = lVar13 + 0x30;
  } while (lVar13 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First Employee:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  s = (ostream *)std::ostream::flush();
  operator<<(s,local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
               super__Vector_impl_data._M_start);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
  std::ostream::put((char)s);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All Employees:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  print<std::vector<Employee,_std::allocator<Employee>_>_>(&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Employees older than 40 years old:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            (&local_48,
             (vector<Employee,_std::allocator<Employee>_> *)
             local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_start,
             (anon_class_8_1_3dfc913a)
             local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_finish);
  print<std::vector<Employee,_std::allocator<Employee>_>_>(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Employees older than 45 years old (again in functional composition):",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            ((vector<Employee,_std::allocator<Employee>_> *)local_138,
             (vector<Employee,_std::allocator<Employee>_> *)
             local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_start,
             (anon_class_8_1_3dfc913a)
             local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_finish);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)local_138);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Female employees who take less salary than 9000TL:",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  pEVar8 = local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_178._M_impl._0_4_ = 0;
  local_178._M_impl._4_4_ = 0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = 0;
  if (local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  }
  else {
    __x = local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      if ((__x->salary <= 9000.0 && __x->salary != 9000.0) && (__x->gender == Female)) {
        std::vector<Employee,_std::allocator<Employee>_>::push_back
                  ((vector<Employee,_std::allocator<Employee>_> *)local_138,__x);
      }
      __x = __x + 1;
    } while (__x != pEVar8);
    local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_138._16_8_;
    local_178._M_impl._0_4_ = local_138._0_4_;
    local_178._M_impl._4_4_ = local_138._4_4_;
    local_178._M_impl.super__Rb_tree_header._M_header._M_color = local_138._8_4_;
    local_178._M_impl.super__Rb_tree_header._M_header._4_4_ = local_138._12_4_;
  }
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = 0;
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_138);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)&local_178);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)&local_178);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Employees grouped by age ranges of 10 year increments:",0x36);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  local_138._24_8_ = local_138 + 8;
  local_138._16_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_110 = 0;
  local_140 = local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_118 = (_Base_ptr)local_138._24_8_;
  if (local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar8 = local_1f0.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar1 = pEVar8->age / 10;
      uVar12 = iVar1 * 10;
      uVar14 = iVar1 * -10;
      if ((int)uVar14 < 0) {
        uVar14 = uVar12;
      }
      uVar9 = 1;
      if (9 < uVar14) {
        uVar5 = (ulong)uVar14;
        uVar2 = 4;
        do {
          uVar9 = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            uVar9 = uVar9 - 2;
            goto LAB_001049b0;
          }
          if (uVar3 < 1000) {
            uVar9 = uVar9 - 1;
            goto LAB_001049b0;
          }
          if (uVar3 < 10000) goto LAB_001049b0;
          uVar5 = uVar5 / 10000;
          uVar2 = uVar9 + 4;
        } while (99999 < uVar3);
        uVar9 = uVar9 + 1;
      }
LAB_001049b0:
      local_1d8._0_8_ = &local_1c8;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 (ulong)(-((int)uVar12 >> 0x1f) + uVar9),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_1d8._0_8_ + (ulong)(uint)-((int)uVar12 >> 0x1f)),uVar9,uVar14);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8
                      ,"..");
      local_220 = (undefined1  [8])(pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if (local_220 == (undefined1  [8])paVar6) {
        local_210[0]._0_8_ = paVar6->_M_allocated_capacity;
        local_210[0]._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_220 = (undefined1  [8])local_210;
      }
      else {
        local_210[0]._0_8_ = paVar6->_M_allocated_capacity;
      }
      pfStack_218 = (pointer)pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      uVar12 = uVar12 + 9;
      uVar14 = -uVar12;
      if (0 < (int)uVar12) {
        uVar14 = uVar12;
      }
      uVar9 = 1;
      if (9 < uVar14) {
        uVar5 = (ulong)uVar14;
        uVar2 = 4;
        do {
          uVar9 = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            uVar9 = uVar9 - 2;
            goto LAB_00104a99;
          }
          if (uVar3 < 1000) {
            uVar9 = uVar9 - 1;
            goto LAB_00104a99;
          }
          if (uVar3 < 10000) goto LAB_00104a99;
          uVar5 = uVar5 / 10000;
          uVar2 = uVar9 + 4;
        } while (99999 < uVar3);
        uVar9 = uVar9 + 1;
      }
LAB_00104a99:
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_1b8,(ulong)(-((int)uVar12 >> 0x1f) + uVar9),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_1b8._M_dataplus._M_p + (uint)-((int)uVar12 >> 0x1f),uVar9,uVar14);
      uVar11 = 0xf;
      if (local_220 != (undefined1  [8])local_210) {
        uVar11 = local_210[0]._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_1b8._M_string_length + (long)pfStack_218) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          uVar11 = local_1b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_1b8._M_string_length + (long)pfStack_218) goto LAB_00104b22;
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1b8,0,0,(char *)local_220,(size_type)pfStack_218);
      }
      else {
LAB_00104b22:
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_220,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      }
      local_198._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar6) {
        local_198.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_198._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      paVar6->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if (local_220 != (undefined1  [8])local_210) {
        operator_delete((void *)local_220,local_210[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
                           *)local_138,&local_198);
      std::vector<Employee,_std::allocator<Employee>_>::push_back(this,pEVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 != local_140);
    if (local_138._16_8_ != 0) {
      local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_138._16_8_;
      *(_Rb_tree_header **)(local_138._16_8_ + 8) = &local_178._M_impl.super__Rb_tree_header;
      local_178._M_impl.super__Rb_tree_header._M_node_count = local_110;
      local_138._16_8_ = 0;
      psVar10 = &local_110;
      local_178._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_138._24_8_;
      local_178._M_impl.super__Rb_tree_header._M_header._M_right = local_118;
      local_178._M_impl.super__Rb_tree_header._M_header._M_color = local_138._8_4_;
      local_138._24_8_ = (_Base_ptr)(local_138 + 8);
      local_118 = (_Base_ptr)(local_138 + 8);
      goto LAB_00104cce;
    }
  }
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  psVar10 = &local_178._M_impl.super__Rb_tree_header._M_node_count;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00104cce:
  *psVar10 = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
               *)local_138);
  print<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
              *)&local_178);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Number of employees available in age ranges of 10 year increments:",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (local_138,&local_178);
  print<std::__cxx11::string,unsigned_long>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)local_138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Number of employees available in age ranges of 10 year increments (again):",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (local_220,&local_178);
  print<std::__cxx11::string,unsigned_long>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)local_220);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_220);
  local_220 = (undefined1  [8])0x140000000a;
  pfStack_218 = (pointer)CONCAT44(pfStack_218._4_4_,0x1e);
  lVar13 = 0;
  do {
    *(int *)(local_220 + lVar13) = *(int *)(local_220 + lVar13) * *(int *)(local_220 + lVar13);
    lVar13 = lVar13 + 4;
  } while (lVar13 != 0xc);
  local_1d8._0_8_ = local_220;
  local_1d8._8_4_ = pfStack_218._0_4_;
  print<std::array<int,_3UL>_>((array<int,_3UL> *)local_1d8);
  local_220 = (undefined1  [8])0x40533333408ccccd;
  pfStack_218 = (pointer)0x3f8ccccd400ccccd;
  print<std::array<float,_4UL>_>((array<float,_4UL> *)local_220);
  local_1b8._M_dataplus._M_p = (pointer)0x400ccccd3f8ccccd;
  local_1b8._M_string_length = 0x408ccccd40533333;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_1b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1d8,__l_00,(allocator_type *)&local_198)
  ;
  reverse<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_220,
             (vector<float,_std::allocator<float>_> *)local_1d8);
  print<std::vector<float,_std::allocator<float>_>_>
            ((vector<float,_std::allocator<float>_> *)local_220);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,local_210[0]._M_allocated_capacity - (long)local_220);
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity - local_1d8._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~_Rb_tree(&local_178);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&local_48);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&local_1f0);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto employees = std::vector<Employee>{
        {"Fatih", Male, 35, 8500},
        {"Elif", Female, 28, 6350},
        {"Erkin", Male, 43, 9500},
        {"Mehmet", Male, 46, 10500},
        {"Melis", Female, 48, 12500},
        };

    // Q1) (5pts) Make employee directly sendable to the console
    std::cout << "First Employee:" << std::endl << employees[0] << std::endl;
    // Fatih, Male, 35, 8500TL

    // Q2) (5pts) Create a print overload that can print "employees" variable
    std::cout << "All Employees:" << std::endl;
    print(employees);
    // [Fatih, Male, 35, 8500TL]; [Elif, Female, 28, 6350TL]; [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    auto age_thresh = 40;

    // Q3) (5pts) Create a filter overload that can work with any kind of containers. Make it work with "employees"
    std::cout << "Employees older than 40 years old:" << std::endl;
    auto lambda_filter = [&age_thresh](const Employee& e) { return e.age > age_thresh; };
    auto age_gt_40 = filter(employees, lambda_filter);
    print(age_gt_40);
    // [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q4a) (5pts) Apply filter to a container by & operator
    // Q4b) (5pts) Send container to console by piping it to PRINT with | operator.
    age_thresh = 45;
    std::cout << "Employees older than 45 years old (again in functional composition):" << std::endl;
    employees & lambda_filter | PRINT;
    // [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q5) (5pts) Make below code work.
    std::cout << "Female employees who take less salary than 9000TL:" << std::endl;
    print(filter(employees, [](const Employee& e) { return e.salary < 9000 && e.gender == Female; }));
    // [Elif, Female, 28, 6350TL]

    // Q6a) (15pts) Create a group_by algorithm that can group elements of a container by a specific criterion
    // Q6b) (5pts) Group employees by age ranges of 10 year increments by filling in lambda_group below
    // Q6c) (5pts) Make the grouped result printable via print(grouped) as below
    std::cout << "Employees grouped by age ranges of 10 year increments:" << std::endl;
    auto lambda_group = [](const Employee& e) {
        auto a = e.age/10*10; // note: division of integer truncates the result.
        auto b = a+9;
        return std::to_string(a) + ".." + std::to_string(b);
    };
    auto grouped = group_by(employees, lambda_group);
    print(grouped);
    // <20..29>: [Elif, Female, 28, 6350TL]
    // <30..39>: [Fatih, Male, 35, 8500TL]
    // <40..49>: [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q7a) (10pts) Create a transform algorithm that can work on "grouped" variable.
    // Q7b) (5pts) Write necessary transformation lambda for aggregating each group's element count.
    // Q7c) (5pts) Make the grouped and transformed result printable via print(grouped_transformed) as below
    std::cout << "Number of employees available in age ranges of 10 year increments:" << std::endl;
    auto lambda_transform = [](const auto& pair) {
        using Key = typename remove_const<decltype(pair.first)>::type;
        using Value = size_t;
        return std::pair<Key, Value>{pair.first, pair.second.size()};
    };
    auto grouped_transformed = transform(grouped, lambda_transform);
    print(grouped_transformed);
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q8) (10pts) Make the below code work as the same as Q7's code block
    std::cout << "Number of employees available in age ranges of 10 year increments (again):" << std::endl;
    grouped | lambda_transform | PRINT;
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q9) (5pts) Make below line work
    std::array<int, 3>{10, 20, 30} | [](int a) { return a*a; } | PRINT;
    // [100]; [400]; [900]

    // Q10) Overload "operator-" to get the reverse of passed container
    // Q10a) (5pts) Make it work with array containers with the result pipable to PRINT as below
    // Q10b) (5pts) Make it work with other containers with the result pipable to PRINT as below
    -std::array<float, 4>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]
    -std::vector<float>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]

    return 0;
}